

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLScanner::setAttrDupChkRegistry
          (XMLScanner *this,XMLSize_t *attrNumber,bool *toUseHashTable)

{
  RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *this_00;
  
  if (100 < *attrNumber) {
    *toUseHashTable = true;
    if (this->fAttrDupChkRegistry !=
        (RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *)0x0) {
      RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::removeAll
                (this->fAttrDupChkRegistry);
      return;
    }
    this_00 = (RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::RefHash2KeysTableOf
              (this_00,*attrNumber * 2 + 1,false,this->fMemoryManager);
    this->fAttrDupChkRegistry = this_00;
  }
  return;
}

Assistant:

inline void XMLScanner::setAttrDupChkRegistry(const XMLSize_t    &attrNumber
                                            ,       bool         &toUseHashTable)
{
   // once the attribute exceed 100, we use hash table to check duplication
    if (attrNumber > 100)
   {
        toUseHashTable = true;

        if (!fAttrDupChkRegistry)
        {
            fAttrDupChkRegistry = new (fMemoryManager) RefHash2KeysTableOf<XMLAttr>
            (
              2*attrNumber+1, false, fMemoryManager
            );
        }
        else
        {
            fAttrDupChkRegistry->removeAll();
        }
    }

}